

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FileUtil.cpp
# Opt level: O0

void __thiscall AppendFile::append(AppendFile *this,char *logline,size_t len)

{
  int iVar1;
  ssize_t sVar2;
  size_t in_RCX;
  void *in_RDX;
  int in_ESI;
  AppendFile *in_RDI;
  int err;
  size_t x;
  size_t remain;
  size_t n;
  void *local_28;
  long local_20;
  
  local_20 = write(in_RDI,in_ESI,in_RDX,in_RCX);
  while( true ) {
    local_28 = (void *)((long)in_RDX - local_20);
    if (local_28 == (void *)0x0) {
      return;
    }
    sVar2 = write(in_RDI,in_ESI + (int)local_20,local_28,in_RCX);
    if (sVar2 == 0) break;
    local_20 = sVar2 + local_20;
  }
  iVar1 = ferror((FILE *)in_RDI->fp_);
  if (iVar1 == 0) {
    return;
  }
  fprintf(_stderr,"AppendFile::append() failed !\n");
  return;
}

Assistant:

void AppendFile::append(const char *logline, const size_t len){
    size_t n = this->write(logline, len);
    size_t remain = len -n;
    while (remain>0) {
        size_t x = this->write(logline+n, remain);
        if(x==0){
            int err = ferror(fp_);  // 检查文件流是否出错，若错返回0，否则非0. 
            if(err) fprintf(stderr, "AppendFile::append() failed !\n");
            break;
        }
        n+=x;
        remain = len -n;
    }
}